

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O0

Vec_Int_t * Bmc_ManBCoreCollectPivots(Gia_Man_t *p,char *pName,Vec_Int_t *vVarMap)

{
  int iVar1;
  uint v;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  Vec_Int_t *vVars;
  Vec_Int_t *vPivots;
  int iFrame;
  int iVar;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVarMap_local;
  char *pName_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Bmc_ManBCoreReadPivots(pName);
  iFrame = 0;
  while( true ) {
    bVar3 = false;
    if (iFrame < p->nObjs) {
      _iVar = Gia_ManObj(p,iFrame);
      bVar3 = _iVar != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_iVar = *(ulong *)_iVar & 0xffffffffbfffffff;
    iFrame = iFrame + 1;
  }
  for (iFrame = 0; iVar1 = Vec_IntSize(p_01), iFrame < iVar1; iFrame = iFrame + 1) {
    v = Vec_IntEntry(p_01,iFrame);
    if (((int)v < 1) || (iVar1 = Gia_ManObjNum(p), iVar1 <= (int)v)) {
      printf("Cannot find object with Id %d in the given AIG.\n",(ulong)v);
    }
    else {
      pGVar2 = Gia_ManObj(p,v);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
    }
  }
  for (iFrame = 0; iVar1 = Vec_IntSize(vVarMap), iFrame + 1 < iVar1; iFrame = iFrame + 2) {
    iVar1 = Vec_IntEntry(vVarMap,iFrame);
    Vec_IntEntry(vVarMap,iFrame + 1);
    pGVar2 = Gia_ManObj(p,iVar1);
    if ((*(ulong *)pGVar2 >> 0x1e & 1) != 0) {
      iVar1 = Abc_Lit2Var(iFrame);
      Vec_IntPush(p_00,iVar1);
    }
  }
  iFrame = 0;
  while( true ) {
    bVar3 = false;
    if (iFrame < p->nObjs) {
      _iVar = Gia_ManObj(p,iFrame);
      bVar3 = _iVar != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)_iVar = *(ulong *)_iVar & 0xffffffffbfffffff;
    iFrame = iFrame + 1;
  }
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollectPivots( Gia_Man_t * p, char * pName, Vec_Int_t * vVarMap )
{
    Gia_Obj_t * pObj;
    int i, iVar, iFrame;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    Vec_Int_t * vVars = Bmc_ManBCoreReadPivots( pName );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntForEachEntry( vVars, iVar, i )
        if ( iVar > 0 && iVar < Gia_ManObjNum(p) )
            Gia_ManObj( p, iVar )->fMark0 = 1;
        else
            printf( "Cannot find object with Id %d in the given AIG.\n", iVar );
    Vec_IntForEachEntryDouble( vVarMap, iVar, iFrame, i )
        if ( Gia_ManObj( p, iVar )->fMark0 )
            Vec_IntPush( vPivots, Abc_Lit2Var(i) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntFree( vVars );
    return vPivots;
}